

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CovarianceMatrix.cpp
# Opt level: O3

void __thiscall CovarianceMatrix::loadFeatures(CovarianceMatrix *this)

{
  pointer *ppFVar1;
  _WordT *p_Var2;
  iterator __position;
  undefined8 __nptr;
  char cVar3;
  int iVar4;
  int iVar5;
  size_t *__s;
  istream *piVar6;
  size_t sVar7;
  int *piVar8;
  long lVar9;
  size_t sVar10;
  long *plVar11;
  proto_child0 peVar12;
  size_type *psVar13;
  ulong uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  ulong uVar15;
  int iVar16;
  int numOfFeatures;
  string line;
  int degreeOfInteractions;
  string attrName;
  string rootName;
  string typeOfFeature;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  Feature f;
  stringstream ssLine;
  ifstream input;
  undefined1 local_7e4 [4];
  char *local_7e0;
  long local_7d8;
  char local_7d0 [20];
  undefined1 local_7bc [4];
  string local_7b8;
  string local_798;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_778;
  char local_768 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  vector<Feature,std::allocator<Feature>> *local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  undefined1 local_6f0 [816];
  long local_3c0 [2];
  ostream local_3b0 [112];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  __s = (size_t *)operator_new__(800);
  memset(__s,0,800);
  this->_queryRootIndex = __s;
  std::ifstream::ifstream
            ((istream *)local_238,(string *)multifaq::config::FEATURE_CONF_abi_cxx11_,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   multifaq::config::FEATURE_CONF_abi_cxx11_," does not exist. \n");
    std::operator<<((ostream *)&std::cerr,(string *)local_6f0);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f0;
LAB_00195de3:
    std::__cxx11::string::~string((string *)this_00);
LAB_00195de8:
    exit(1);
  }
  local_7e0 = local_7d0;
  local_7d8 = 0;
  local_7d0[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
  local_7e4 = (undefined1  [4])0x0;
  local_7bc = (undefined1  [4])0x0;
  do {
    do {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_7e0,cVar3);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) goto LAB_00195873;
    } while (*local_7e0 == '#');
    iVar4 = std::__cxx11::string::compare((char *)&local_7e0);
  } while (iVar4 == 0);
LAB_00195873:
  local_798._M_dataplus._M_p = local_7e4;
  local_778._8_8_ = &local_798;
  local_7b8._M_dataplus._M_p = (pointer)&local_778;
  local_778._M_allocated_capacity = (size_type)&boost::spirit::int_;
  local_6f0._0_8_ = local_7bc + 4;
  local_7b8._M_string_length = 0x2ac900;
  local_730._M_dataplus._M_p = local_7bc;
  local_758._M_string_length = (size_type)&local_730;
  local_6f0._8_8_ = local_768 + 0x10;
  local_758._M_dataplus._M_p = &boost::spirit::int_;
  local_710._M_dataplus._M_p = local_7e0;
  boost::spirit::qi::detail::
  phrase_parse_impl<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::int_>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<int>>,0l>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::int_>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<int>>,0l>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&>,2l>,void>
  ::
  call<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_710,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_7e0 + local_7d8),
             (expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::int_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::int_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_2L>
              *)local_6f0,
             (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>
              *)&boost::spirit::ascii::space,postskip);
  if (0 < (int)local_7e4) {
    local_738 = (vector<Feature,std::allocator<Feature>> *)
                &(this->super_Application)._listOfFeatures;
    iVar4 = 0;
    do {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_7e0,cVar3);
      if (*local_7e0 != '#') {
        iVar5 = std::__cxx11::string::compare((char *)&local_7e0);
        if (iVar5 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(local_3b0,local_7e0,local_7d8);
          local_7b8._M_string_length = 0;
          local_7b8.field_2._M_local_buf[0] = '\0';
          local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_3c0,(string *)(local_7bc + 4),':');
          local_778._8_8_ = (string *)0x0;
          local_768[0] = '\0';
          local_778._M_allocated_capacity = (size_type)local_768;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_3c0,(string *)local_778._M_local_buf,':');
          local_798._M_string_length = 0;
          local_798.field_2._M_local_buf[0] = '\0';
          local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_3c0,(string *)&local_798,':');
          sVar7 = TreeDecomposition::getAttributeIndex
                            ((this->_td).
                             super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,(string *)(local_7bc + 4));
          __nptr = local_778._M_allocated_capacity;
          piVar8 = __errno_location();
          iVar5 = *piVar8;
          *piVar8 = 0;
          lVar9 = strtol((char *)__nptr,(char **)local_6f0,10);
          if (local_6f0._0_8_ != __nptr) {
            iVar16 = (int)lVar9;
            if ((iVar16 == lVar9) && (*piVar8 != 0x22)) {
              if (*piVar8 == 0) {
                *piVar8 = iVar5;
              }
              sVar10 = TreeDecomposition::getRelationIndex
                                 ((this->_td).
                                  super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,&local_798);
              if ((int)sVar7 == -1) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_768 + 0x10),"Attribute |",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_7bc + 4));
                plVar11 = (long *)std::__cxx11::string::append(local_768 + 0x10);
                local_6f0._0_8_ = *plVar11;
                peVar12 = (proto_child0)(plVar11 + 2);
                if ((proto_child0)local_6f0._0_8_ == peVar12) {
                  local_6f0._16_8_ = peVar12->child0;
                  local_6f0._24_8_ = plVar11[3];
                  local_6f0._0_8_ = (proto_child0)(local_6f0 + 0x10);
                }
                else {
                  local_6f0._16_8_ = peVar12->child0;
                }
                local_6f0._8_8_ = plVar11[1];
                *plVar11 = (long)peVar12;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                std::operator<<((ostream *)&std::cerr,(string *)local_6f0);
                std::__cxx11::string::~string((string *)local_6f0);
                this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_768 + 0x10);
              }
              else {
                if ((int)sVar10 != -1) {
                  if (iVar16 != 1 || iVar4 != 0) {
                    piVar8 = (int *)(long)(int)sVar7;
                    if ((int *)0x63 < piVar8) goto LAB_00195cca;
                    uVar14 = 1L << ((byte)sVar7 & 0x3f);
                    uVar15 = (ulong)piVar8 >> 6;
                    p_Var2 = (this->super_Application)._isFeature.super__Base_bitset<2UL>._M_w +
                             uVar15;
                    *p_Var2 = *p_Var2 | uVar14;
                    p_Var2 = (this->super_Application)._features.super__Base_bitset<2UL>._M_w +
                             uVar15;
                    *p_Var2 = *p_Var2 | uVar14;
                    memset(local_6f0,0,0x330);
                    if (iVar16 == 0) {
                      this->_queryRootIndex[(long)piVar8] =
                           ((this->_td).
                            super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->_root->_id;
                      local_3c0[(long)(piVar8 + -0x19)] = local_3c0[(long)(piVar8 + -0x19)] + 1;
                    }
                    else {
                      p_Var2 = (this->_categoricalFeatures).super__Base_bitset<2UL>._M_w + uVar15;
                      *p_Var2 = *p_Var2 | uVar14;
                      this->_queryRootIndex[(long)piVar8] = (long)(int)sVar10;
                      *(ulong *)(local_6f0 + uVar15 * 8) =
                           *(ulong *)(local_6f0 + uVar15 * 8) | uVar14;
                      p_Var2 = (this->super_Application)._isCategoricalFeature.
                               super__Base_bitset<2UL>._M_w + uVar15;
                      *p_Var2 = *p_Var2 | uVar14;
                    }
                    __position._M_current =
                         (this->super_Application)._listOfFeatures.
                         super__Vector_base<Feature,_std::allocator<Feature>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (__position._M_current ==
                        (this->super_Application)._listOfFeatures.
                        super__Vector_base<Feature,_std::allocator<Feature>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<Feature,std::allocator<Feature>>::
                      _M_realloc_insert<Feature_const&>(local_738,__position,(Feature *)local_6f0);
                    }
                    else {
                      memcpy(__position._M_current,local_6f0,0x330);
                      ppFVar1 = &(this->super_Application)._listOfFeatures.
                                 super__Vector_base<Feature,_std::allocator<Feature>_>._M_impl.
                                 super__Vector_impl_data._M_finish;
                      *ppFVar1 = *ppFVar1 + 1;
                    }
                    if (iVar4 == 0) {
                      this->labelID = (size_t)piVar8;
                    }
                    std::ios::clear((int)*(undefined8 *)(local_3c0[0] + -0x18) + (int)local_3c0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_798._M_dataplus._M_p != &local_798.field_2) {
                      operator_delete(local_798._M_dataplus._M_p);
                    }
                    if ((char *)local_778._M_allocated_capacity != local_768) {
                      operator_delete((void *)local_778._M_allocated_capacity);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
                      operator_delete(local_7b8._M_dataplus._M_p);
                    }
                    iVar4 = iVar4 + 1;
                    goto LAB_00195bfc;
                  }
                  std::operator<<((ostream *)&std::cerr,"The label needs to be continuous! ");
                  goto LAB_00195de8;
                }
                std::operator+(&local_710,"Relation |",&local_798);
                plVar11 = (long *)std::__cxx11::string::append((char *)&local_710);
                local_730._M_dataplus._M_p = (pointer)*plVar11;
                psVar13 = (size_type *)(plVar11 + 2);
                if ((size_type *)local_730._M_dataplus._M_p == psVar13) {
                  local_730.field_2._M_allocated_capacity = *psVar13;
                  local_730.field_2._8_8_ = plVar11[3];
                  local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
                }
                else {
                  local_730.field_2._M_allocated_capacity = *psVar13;
                }
                local_730._M_string_length = plVar11[1];
                *plVar11 = (long)psVar13;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_768 + 0x10),&local_730,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_7bc + 4));
                plVar11 = (long *)std::__cxx11::string::append(local_768 + 0x10);
                local_6f0._0_8_ = *plVar11;
                peVar12 = (proto_child0)(plVar11 + 2);
                if ((proto_child0)local_6f0._0_8_ == peVar12) {
                  local_6f0._16_8_ = peVar12->child0;
                  local_6f0._24_8_ = plVar11[3];
                  local_6f0._0_8_ = (proto_child0)(local_6f0 + 0x10);
                }
                else {
                  local_6f0._16_8_ = peVar12->child0;
                }
                local_6f0._8_8_ = plVar11[1];
                *plVar11 = (long)peVar12;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                std::operator<<((ostream *)&std::cerr,(string *)local_6f0);
                std::__cxx11::string::~string((string *)local_6f0);
                std::__cxx11::string::~string((string *)(local_768 + 0x10));
                std::__cxx11::string::~string((string *)&local_730);
                this_00 = &local_710;
              }
              goto LAB_00195de3;
            }
            std::__throw_out_of_range("stoi");
          }
          std::__throw_invalid_argument("stoi");
LAB_00195cca:
          std::__throw_out_of_range_fmt
                    ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",piVar8,100)
          ;
        }
      }
LAB_00195bfc:
    } while (iVar4 < (int)local_7e4);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
  std::ios_base::~ios_base(local_340);
  if (local_7e0 != local_7d0) {
    operator_delete(local_7e0);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void CovarianceMatrix::loadFeatures()
{
    _queryRootIndex = new size_t[NUM_OF_VARIABLES]();
    
    /* Load the two-pass variables config file into an input stream. */
    ifstream input(FEATURE_CONF);

    if (!input)
    {
        ERROR(FEATURE_CONF +" does not exist. \n");
        exit(1);
    }

    /* String and associated stream to receive lines from the file. */
    string line;
    stringstream ssLine;

    int numOfFeatures = 0;
    int degreeOfInteractions = 0;
    
    /* Ignore comment and empty lines at the top */
    while (getline(input, line))
    {
        if (line[0] == COMMENT_CHAR || line == "")
            continue;

        break;
    }
    
    /* 
     * Extract number of labels, features and interactions from the config. 
     * Parse the line with the three numbers; ignore spaces. 
     */
    bool parsingSuccess =
        qi::phrase_parse(line.begin(), line.end(),

                         /* Begin Boost Spirit grammar. */
                         ((qi::int_[phoenix::ref(numOfFeatures) = qi::_1])
                          >> NUMBER_SEPARATOR_CHAR
                          >> (qi::int_[phoenix::ref(degreeOfInteractions) =
                                       qi::_1])),
                         /*  End grammar. */
                         ascii::space);

    assert(parsingSuccess && "The parsing of the features file has failed.");
    
    /* Read in the features. */
    for (int featureNo = 0; featureNo < numOfFeatures; ++featureNo)
    {
        getline(input, line);
        if (line[0] == COMMENT_CHAR || line == "")
        {
            --featureNo;
            continue;
        }

        ssLine << line;
 
        string attrName;
        /* Extract the name of the attribute in the current line. */
        getline(ssLine, attrName, ATTRIBUTE_NAME_CHAR);

        string typeOfFeature;
        /* Extract the dimension of the current attribute. */
        getline(ssLine, typeOfFeature, ATTRIBUTE_NAME_CHAR);

        string rootName;
        /* Extract the dimension of the current attribute. */
        getline(ssLine, rootName, ATTRIBUTE_NAME_CHAR);

        int attributeID = _td->getAttributeIndex(attrName);
        int categorical = stoi(typeOfFeature); 
        int rootID = _td->getRelationIndex(rootName);

        if (attributeID == -1)
        {
            ERROR("Attribute |"+attrName+"| does not exist.");
            exit(1);
        }

        if (rootID == -1)
        {
            ERROR("Relation |"+rootName+"| for "+attrName+" does not exist.");
            exit(1);
        }

        if (featureNo == 0 && categorical == 1)
        {
            ERROR("The label needs to be continuous! ");
            exit(1);
        }

        _isFeature.set(attributeID);
        _features.set(attributeID);

        Feature f;

        if (categorical)
        {
            _categoricalFeatures.set(attributeID);
            _queryRootIndex[attributeID] = rootID;

            f.head.set(attributeID);
            _isCategoricalFeature.set(attributeID);
        }
        else
        {
            _queryRootIndex[attributeID] = _td->_root->_id;
            ++f.body[attributeID];
        }

        _listOfFeatures.push_back(f);

        if (featureNo == 0)
            labelID = attributeID;
        
        /* Clear string stream. */
        ssLine.clear();
    }
}